

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_delete(nk_text_edit *state,int where,int len)

{
  nk_rune nVar1;
  nk_rune *pnVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  pnVar2 = nk_textedit_createundo(&state->undo,where,len,0);
  if (pnVar2 != (nk_rune *)0x0) {
    uVar4 = 0;
    if (0 < len) {
      uVar4 = (ulong)(uint)len;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      nVar1 = nk_str_rune_at(&state->string,where + (int)uVar3);
      pnVar2[uVar3] = nVar1;
    }
  }
  nk_str_delete_runes(&state->string,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

NK_API void
nk_textedit_delete(struct nk_text_edit *state, int where, int len)
{
    /* delete characters while updating undo */
    nk_textedit_makeundo_delete(state, where, len);
    nk_str_delete_runes(&state->string, where, len);
    state->has_preferred_x = 0;
}